

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_version_manager.cpp
# Opt level: O3

vector<duckdb::MetaBlockPointer,_true> * __thiscall
duckdb::RowVersionManager::Checkpoint
          (vector<duckdb::MetaBlockPointer,_true> *__return_storage_ptr__,RowVersionManager *this,
          MetadataManager *manager)

{
  _Head_base<0UL,_duckdb::ChunkInfo_*,_false> __args_1;
  pointer pMVar1;
  ChunkInfo *pCVar2;
  iterator iVar3;
  int iVar4;
  reference pvVar5;
  vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_true> *__range1;
  pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_> *entry;
  pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_> *ppVar6;
  vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_true> to_serialize;
  MetadataWriter writer;
  pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_> *local_b8;
  iterator iStack_b0;
  pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_> *local_a8;
  unsigned_long local_98;
  vector<duckdb::MetaBlockPointer,_true> *local_90;
  vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_> *local_88;
  MetadataWriter local_80;
  
  if ((this->has_changes == false) &&
     ((this->storage_pointers).
      super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
      super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->storage_pointers).
      super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
      super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    MetadataManager::ClearModifiedBlocks(manager,&this->storage_pointers);
    ::std::vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>::vector
              (&__return_storage_ptr__->
                super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>,
               &(this->storage_pointers).
                super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>);
    return __return_storage_ptr__;
  }
  local_b8 = (pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_> *)0x0;
  iStack_b0._M_current = (pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_> *)0x0;
  local_a8 = (pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_> *)0x0;
  local_80.super_WriteStream._vptr_WriteStream = (_func_int **)0x0;
  if ((this->vector_info).
      super_vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->vector_info).
      super_vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      pvVar5 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
               ::operator[](&this->vector_info,
                            (size_type)local_80.super_WriteStream._vptr_WriteStream);
      __args_1._M_head_impl =
           (pvVar5->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>).
           _M_t.super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>.
           _M_t.super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>
           .super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl;
      if ((__args_1._M_head_impl != (ChunkInfo *)0x0) &&
         (iVar4 = (**(code **)((long)(__args_1._M_head_impl)->_vptr_ChunkInfo + 0x40))
                            (__args_1._M_head_impl), (char)iVar4 != '\0')) {
        if (iStack_b0._M_current == local_a8) {
          ::std::
          vector<std::pair<unsigned_long,std::reference_wrapper<duckdb::ChunkInfo>>,std::allocator<std::pair<unsigned_long,std::reference_wrapper<duckdb::ChunkInfo>>>>
          ::_M_realloc_insert<unsigned_long&,duckdb::ChunkInfo&>
                    ((vector<std::pair<unsigned_long,std::reference_wrapper<duckdb::ChunkInfo>>,std::allocator<std::pair<unsigned_long,std::reference_wrapper<duckdb::ChunkInfo>>>>
                      *)&local_b8,iStack_b0,(unsigned_long *)&local_80,__args_1._M_head_impl);
        }
        else {
          (iStack_b0._M_current)->first =
               (unsigned_long)local_80.super_WriteStream._vptr_WriteStream;
          ((iStack_b0._M_current)->second)._M_data = __args_1._M_head_impl;
          iStack_b0._M_current = iStack_b0._M_current + 1;
        }
      }
      local_80.super_WriteStream._vptr_WriteStream =
           local_80.super_WriteStream._vptr_WriteStream + 1;
    } while (local_80.super_WriteStream._vptr_WriteStream <
             (_func_int **)
             ((long)(this->vector_info).
                    super_vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->vector_info).
                    super_vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3));
    if (local_b8 != iStack_b0._M_current) {
      pMVar1 = (this->storage_pointers).
               super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
               super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->storage_pointers).
          super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
          super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
          _M_impl.super__Vector_impl_data._M_finish != pMVar1) {
        (this->storage_pointers).
        super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
        super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
        _M_impl.super__Vector_impl_data._M_finish = pMVar1;
      }
      MetadataWriter::MetadataWriter
                (&local_80,manager,
                 (optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>)
                 &this->storage_pointers);
      local_98 = (long)iStack_b0._M_current - (long)local_b8 >> 4;
      local_90 = &this->storage_pointers;
      (**local_80.super_WriteStream._vptr_WriteStream)(&local_80,&local_98,8);
      iVar3._M_current = iStack_b0._M_current;
      local_88 = &__return_storage_ptr__->
                  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>;
      if (local_b8 != iStack_b0._M_current) {
        ppVar6 = local_b8;
        do {
          local_98 = ppVar6->first;
          pCVar2 = (ppVar6->second)._M_data;
          (**local_80.super_WriteStream._vptr_WriteStream)(&local_80,&local_98,8);
          (*pCVar2->_vptr_ChunkInfo[9])(pCVar2,&local_80);
          ppVar6 = ppVar6 + 1;
        } while (ppVar6 != iVar3._M_current);
      }
      MetadataWriter::Flush(&local_80);
      __return_storage_ptr__ = (vector<duckdb::MetaBlockPointer,_true> *)local_88;
      this->has_changes = false;
      ::std::vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>::vector
                (local_88,&local_90->
                           super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                );
      MetadataWriter::~MetadataWriter(&local_80);
      goto LAB_01792a1a;
    }
  }
  (__return_storage_ptr__->
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>).
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>).
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>).
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_01792a1a:
  if (local_b8 != (pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_> *)0x0) {
    operator_delete(local_b8);
  }
  return (vector<duckdb::MetaBlockPointer,_true> *)
         &__return_storage_ptr__->
          super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>;
}

Assistant:

vector<MetaBlockPointer> RowVersionManager::Checkpoint(MetadataManager &manager) {
	if (!has_changes && !storage_pointers.empty()) {
		// the row version manager already exists on disk and no changes were made
		// we can write the current pointer as-is
		// ensure the blocks we are pointing to are not marked as free
		manager.ClearModifiedBlocks(storage_pointers);
		// return the root pointer
		return storage_pointers;
	}
	// first count how many ChunkInfo's we need to deserialize
	vector<pair<idx_t, reference<ChunkInfo>>> to_serialize;
	for (idx_t vector_idx = 0; vector_idx < vector_info.size(); vector_idx++) {
		auto chunk_info = vector_info[vector_idx].get();
		if (!chunk_info) {
			continue;
		}
		if (!chunk_info->HasDeletes()) {
			continue;
		}
		to_serialize.emplace_back(vector_idx, *chunk_info);
	}
	if (to_serialize.empty()) {
		return vector<MetaBlockPointer>();
	}

	storage_pointers.clear();

	MetadataWriter writer(manager, &storage_pointers);
	// now serialize the actual version information
	writer.Write<idx_t>(to_serialize.size());
	for (auto &entry : to_serialize) {
		auto &vector_idx = entry.first;
		auto &chunk_info = entry.second.get();
		writer.Write<idx_t>(vector_idx);
		chunk_info.Write(writer);
	}
	writer.Flush();

	has_changes = false;
	return storage_pointers;
}